

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int peek_decode_initial(vorb *f,int *p_left_start,int *p_left_end,int *p_right_start,
                       int *p_right_end,int *mode)

{
  int iVar1;
  int local_44;
  int bytes_read;
  int bits_read;
  int *mode_local;
  int *p_right_end_local;
  int *p_right_start_local;
  int *p_left_end_local;
  int *p_left_start_local;
  vorb *f_local;
  
  iVar1 = vorbis_decode_initial(f,p_left_start,p_left_end,p_right_start,p_right_end,mode);
  if (iVar1 == 0) {
    f_local._4_4_ = 0;
  }
  else {
    iVar1 = ilog(f->mode_count + -1);
    local_44 = iVar1 + 1;
    if (f->mode_config[*mode].blockflag != '\0') {
      local_44 = iVar1 + 3;
    }
    iVar1 = (local_44 + 7) / 8;
    f->bytes_in_seg = f->bytes_in_seg + (char)iVar1;
    f->packet_bytes = f->packet_bytes - iVar1;
    skip(f,-iVar1);
    if (f->next_seg == -1) {
      f->next_seg = f->segment_count + -1;
    }
    else {
      f->next_seg = f->next_seg + -1;
    }
    f->valid_bits = 0;
    f_local._4_4_ = 1;
  }
  return f_local._4_4_;
}

Assistant:

static int peek_decode_initial(vorb *f, int *p_left_start, int *p_left_end, int *p_right_start, int *p_right_end, int *mode)
{
   int bits_read, bytes_read;

   if (!vorbis_decode_initial(f, p_left_start, p_left_end, p_right_start, p_right_end, mode))
      return 0;

   // either 1 or 2 bytes were read, figure out which so we can rewind
   bits_read = 1 + ilog(f->mode_count-1);
   if (f->mode_config[*mode].blockflag)
      bits_read += 2;
   bytes_read = (bits_read + 7) / 8;

   f->bytes_in_seg += bytes_read;
   f->packet_bytes -= bytes_read;
   skip(f, -bytes_read);
   if (f->next_seg == -1)
      f->next_seg = f->segment_count - 1;
   else
      f->next_seg--;
   f->valid_bits = 0;

   return 1;
}